

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

void __thiscall
icu_63::TimeZoneFormat::initGMTOffsetPatterns(TimeZoneFormat *this,UErrorCode *status)

{
  UVector *pUVar1;
  OffsetFields required;
  int32_t type;
  uint uVar2;
  long lVar3;
  UnicodeString *pattern;
  
  pattern = (UnicodeString *)&this->field_0x280;
  lVar3 = 0;
  do {
    uVar2 = (uint)lVar3;
    if (uVar2 < 6) {
      if ((5U >> (uVar2 & 0x1f) & 1) == 0) {
        required = FIELDS_H;
        if ((10U >> (uVar2 & 0x1f) & 1) != 0) {
          required = FIELDS_HMS;
        }
      }
      else {
        required = FIELDS_HM;
      }
      pUVar1 = parseOffsetPattern(pattern,required,status);
      this->fGMTOffsetPatternItems[lVar3] = pUVar1;
    }
    lVar3 = lVar3 + 1;
    pattern = pattern + 1;
  } while (lVar3 != 6);
  checkAbuttingHoursAndMinutes(this);
  return;
}

Assistant:

void
TimeZoneFormat::initGMTOffsetPatterns(UErrorCode& status) {
    for (int32_t type = 0; type < UTZFMT_PAT_COUNT; type++) {
        switch (type) {
        case UTZFMT_PAT_POSITIVE_H:
        case UTZFMT_PAT_NEGATIVE_H:
            fGMTOffsetPatternItems[type] = parseOffsetPattern(fGMTOffsetPatterns[type], FIELDS_H, status);
            break;
        case UTZFMT_PAT_POSITIVE_HM:
        case UTZFMT_PAT_NEGATIVE_HM:
            fGMTOffsetPatternItems[type] = parseOffsetPattern(fGMTOffsetPatterns[type], FIELDS_HM, status);
            break;
        case UTZFMT_PAT_POSITIVE_HMS:
        case UTZFMT_PAT_NEGATIVE_HMS:
            fGMTOffsetPatternItems[type] = parseOffsetPattern(fGMTOffsetPatterns[type], FIELDS_HMS, status);
            break;
        }
    }
    checkAbuttingHoursAndMinutes();
}